

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O2

void __thiscall icu_63::NFRuleSet::appendRules(NFRuleSet *this,UnicodeString *result)

{
  NFRule *this_00;
  NFRule *this_01;
  long lVar1;
  uint32_t fIdx;
  ulong uVar2;
  
  UnicodeString::append(result,&this->name);
  UnicodeString::append(result,L':');
  UnicodeString::append(result,L'\n');
  for (uVar2 = 0; uVar2 < (this->rules).fCount; uVar2 = uVar2 + 1) {
    NFRule::_appendRuleText((this->rules).fStuff[uVar2],result);
    UnicodeString::append(result,L'\n');
  }
  for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 1) {
    this_00 = this->nonNumericalRules[lVar1];
    if (this_00 != (NFRule *)0x0) {
      if (this_00->baseValue + 4U < 3) {
        for (uVar2 = 0; uVar2 < (this->fractionRules).fCount; uVar2 = uVar2 + 1) {
          this_01 = (this->fractionRules).fStuff[uVar2];
          if (this_01->baseValue == this_00->baseValue) {
            NFRule::_appendRuleText(this_01,result);
            UnicodeString::append(result,L'\n');
          }
        }
      }
      else {
        NFRule::_appendRuleText(this_00,result);
        UnicodeString::append(result,L'\n');
      }
    }
  }
  return;
}

Assistant:

void
NFRuleSet::appendRules(UnicodeString& result) const
{
    uint32_t i;

    // the rule set name goes first...
    result.append(name);
    result.append(gColon);
    result.append(gLineFeed);

    // followed by the regular rules...
    for (i = 0; i < rules.size(); i++) {
        rules[i]->_appendRuleText(result);
        result.append(gLineFeed);
    }

    // followed by the special rules (if they exist)
    for (i = 0; i < NON_NUMERICAL_RULE_LENGTH; ++i) {
        NFRule *rule = nonNumericalRules[i];
        if (nonNumericalRules[i]) {
            if (rule->getBaseValue() == NFRule::kImproperFractionRule
                || rule->getBaseValue() == NFRule::kProperFractionRule
                || rule->getBaseValue() == NFRule::kMasterRule)
            {
                for (uint32_t fIdx = 0; fIdx < fractionRules.size(); fIdx++) {
                    NFRule *fractionRule = fractionRules[fIdx];
                    if (fractionRule->getBaseValue() == rule->getBaseValue()) {
                        fractionRule->_appendRuleText(result);
                        result.append(gLineFeed);
                    }
                }
            }
            else {
                rule->_appendRuleText(result);
                result.append(gLineFeed);
            }
        }
    }
}